

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::SocketWriter::Send(SocketWriter *this,string *message)

{
  int __fd;
  bool bVar1;
  ostream *poVar2;
  void *__buf;
  size_t sVar3;
  ostream *poVar4;
  long in_RDI;
  char *unaff_retaddr;
  GTestLogSeverity in_stack_0000000c;
  GTestLog *in_stack_00000010;
  size_t len;
  GTestLog *in_stack_ffffffffffffff90;
  GTestLog local_34;
  size_t local_30;
  GTestLog local_14 [4];
  int line;
  
  unique0x100001d2 = in_RDI;
  bVar1 = IsTrue(*(int *)(in_RDI + 8) != -1);
  line = (int)((ulong)stack0xfffffffffffffff8 >> 0x20);
  if (!bVar1) {
    GTestLog::GTestLog(in_stack_00000010,in_stack_0000000c,unaff_retaddr,line);
    poVar2 = GTestLog::GetStream(local_14);
    poVar2 = std::operator<<(poVar2,"Condition sockfd_ != -1 failed. ");
    std::operator<<(poVar2,"Send() can be called only when there is a connection.");
    GTestLog::~GTestLog(in_stack_ffffffffffffff90);
  }
  local_30 = std::__cxx11::string::length();
  __fd = *(int *)(in_RDI + 8);
  __buf = (void *)std::__cxx11::string::c_str();
  sVar3 = write(__fd,__buf,local_30);
  if (sVar3 != local_30) {
    GTestLog::GTestLog(in_stack_00000010,in_stack_0000000c,unaff_retaddr,line);
    poVar2 = GTestLog::GetStream(&local_34);
    poVar2 = std::operator<<(poVar2,"stream_result_to: failed to stream to ");
    poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 0x10));
    poVar4 = std::operator<<(poVar2,":");
    std::operator<<(poVar4,(string *)(in_RDI + 0x30));
    GTestLog::~GTestLog((GTestLog *)poVar2);
  }
  return;
}

Assistant:

void Send(const std::string& message) override {
      GTEST_CHECK_(sockfd_ != -1)
          << "Send() can be called only when there is a connection.";

      const auto len = static_cast<size_t>(message.length());
      if (write(sockfd_, message.c_str(), len) != static_cast<ssize_t>(len)) {
        GTEST_LOG_(WARNING) << "stream_result_to: failed to stream to "
                            << host_name_ << ":" << port_num_;
      }
    }